

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cxx17_string_view.cpp
# Opt level: O0

void __thiscall
iu_StringViewSplit_x_iutest_x_chain_front_by_stl_str_view_Test<char>::Body
          (iu_StringViewSplit_x_iutest_x_chain_front_by_stl_str_view_Test<char> *this)

{
  basic_string_view<char,_std::char_traits<char>_> delim_00;
  bool bVar1;
  char *pcVar2;
  basic_string_view<char,_std::char_traits<char>_> *in_R9;
  AssertionHelper local_278;
  Fixed local_238;
  bool local_a8;
  undefined7 uStack_a7;
  size_t local_a0;
  b_str_view<char_type> local_98;
  split_helper_index<std::basic_string_view<char,_std::char_traits<char>_>,_false,_false,_false>
  local_88;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  char *local_60;
  undefined1 local_58 [8];
  AssertionResult iutest_ar;
  basic_string_view<char,_std::char_traits<char>_> delim;
  basic_string_view<char,_std::char_traits<char>_> s;
  iu_StringViewSplit_x_iutest_x_chain_front_by_stl_str_view_Test<char> *this_local;
  
  pcVar2 = constant::arikitari_na_world_underscore<char>();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&delim._M_str,pcVar2);
  pcVar2 = constant::space_underscore<char>();
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&iutest_ar.m_result,pcVar2);
  iutest::detail::AlwaysZero();
  local_60 = constant::arikitari<char>();
  local_a8 = iutest_ar.m_result;
  uStack_a7 = iutest_ar._33_7_;
  local_a0 = delim._M_len;
  delim_00._M_str = (char *)delim._M_len;
  delim_00._M_len = iutest_ar._32_8_;
  local_98 = (b_str_view<char_type>)
             split<std::basic_string_view<char,_std::char_traits<char>_>,_nullptr>(delim_00);
  front();
  detail::split_helper<std::basic_string_view<char,_std::char_traits<char>_>,_false,_false,_false>::
  operator>>(&local_88,
             (split_helper<std::basic_string_view<char,_std::char_traits<char>_>,_false,_false,_false>
              *)&local_98);
  local_70 = detail::
             operator|<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_false,_false,_nullptr>
                       ((basic_string_view<char,_std::char_traits<char>_> *)&delim._M_str,&local_88)
  ;
  iutest::internal::EqHelper<false>::
  Compare<char_const*,std::basic_string_view<char,std::char_traits<char>>>
            ((AssertionResult *)local_58,(EqHelper<false> *)"constant::arikitari<char_type>()",
             "s | split(delim) >> front()",(char *)&local_60,(char **)&local_70,in_R9);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_58);
  if (!bVar1) {
    memset(&local_238,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_238);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_58);
    iutest::AssertionHelper::AssertionHelper
              (&local_278,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_cxx17_string_view.cpp"
               ,0x2b,pcVar2,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_278,&local_238);
    iutest::AssertionHelper::~AssertionHelper(&local_278);
    iutest::AssertionHelper::Fixed::~Fixed(&local_238);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_58);
  return;
}

Assistant:

IUTEST_TYPED_TEST(StringViewSplit, chain_front_by_stl_str_view)
{
	using char_type = TypeParam;
	const std::basic_string_view<char_type> s = constant::arikitari_na_world_underscore<char_type>();
	const std::basic_string_view<char_type> delim = constant::space_underscore<char_type>();
	IUTEST_ASSERT_EQ(constant::arikitari<char_type>(), s | split(delim) >> front());
}